

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

char * __thiscall cppcms::impl::string_pool::add(string_pool *this,char *s,size_t len)

{
  size_t size;
  char *pcVar1;
  char *tmp;
  
  size = 0;
  while( true ) {
    if (len == size) {
      pcVar1 = add_bounded_string(this,s,len);
      return pcVar1;
    }
    if (s[size] == '\0') break;
    size = size + 1;
  }
  pcVar1 = add_bounded_string(this,s,size);
  return pcVar1;
}

Assistant:

char *add(char const *s,size_t len)
			{
				char const *tmp = s;
				size_t real_len = 0;
				while(real_len < len && *tmp!=0) {
					real_len ++;
					tmp++;
				}
				return add_bounded_string(s,real_len);
			}